

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_ab9709::Target::DumpInstallDestination
          (Value *__return_storage_ptr__,Target *this,cmInstallTargetGenerator *itGen)

{
  Value *this_00;
  cmListFileBacktrace *bt;
  string local_70;
  Value local_50;
  undefined1 local_21;
  cmInstallTargetGenerator *local_20;
  cmInstallTargetGenerator *itGen_local;
  Target *this_local;
  Value *destination;
  
  local_21 = 0;
  local_20 = itGen;
  itGen_local = (cmInstallTargetGenerator *)this;
  this_local = (Target *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  cmInstallTargetGenerator::GetDestination(&local_70,local_20,this->Config);
  Json::Value::Value(&local_50,&local_70);
  this_00 = Json::Value::operator[](__return_storage_ptr__,"path");
  Json::Value::operator=(this_00,&local_50);
  Json::Value::~Value(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  bt = cmInstallTargetGenerator::GetBacktrace(local_20);
  AddBacktrace(this,__return_storage_ptr__,bt);
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpInstallDestination(cmInstallTargetGenerator* itGen)
{
  Json::Value destination = Json::objectValue;
  destination["path"] = itGen->GetDestination(this->Config);
  this->AddBacktrace(destination, itGen->GetBacktrace());
  return destination;
}